

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O3

uint __thiscall Kernel::Signature::getApp(Signature *this)

{
  Symbol *pSVar1;
  uint uVar2;
  OperatorKey *key;
  OperatorType *pOVar3;
  size_type extraout_RDX;
  initializer_list<Kernel::TermList> sorts;
  bool added;
  bool local_49;
  string local_48;
  
  local_49 = false;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"vAPP","");
  uVar2 = addFunction(this,&local_48,4,&local_49);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_49 == true) {
    this->_appFun = uVar2;
    local_48._M_dataplus._M_p = (pointer)AtomicSort::arrowSort((TermList)0x1,(TermList)0x5);
    local_48._M_string_length = 1;
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x2;
    key = OperatorType::setupKey((OperatorType *)&local_48,sorts);
    *(undefined8 *)(key + 0x18) = 5;
    pOVar3 = OperatorType::getTypeFromKey(key,2);
    pSVar1 = (this->_funs)._stack[uVar2];
    pSVar1->_typeArgsArity = pOVar3->_typeArgsArity;
    pSVar1->_type = pOVar3;
  }
  return uVar2;
}

Assistant:

unsigned Signature::getApp()
{
  bool added = false;
  unsigned app = addFunction("vAPP", 4, added);
  if(added){
    _appFun = app;
    TermList tv1 = TermList(0, false);
    TermList tv2 = TermList(1, false);
    TermList arrowType = AtomicSort::arrowSort(tv1, tv2);
    OperatorType* ot = OperatorType::getFunctionType({arrowType, tv1}, tv2, 2);
    Symbol* sym = getFunction(app);
    sym->setType(ot);
  }
  return app;
}